

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O3

void record_pipelines_pnext_shader(StateRecorder *recorder)

{
  bool bVar1;
  VkShaderModuleValidationCacheCreateInfoEXT validate_info;
  VkComputePipelineCreateInfo pipe;
  VkGraphicsPipelineCreateInfo gpipe;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 *puStack_140;
  undefined8 local_138;
  undefined8 local_130;
  uint32_t *local_128;
  VkComputePipelineCreateInfo local_118;
  VkGraphicsPipelineCreateInfo local_b8;
  
  local_138 = 0;
  local_148 = 0x10;
  local_130 = 0xc;
  local_128 = record_pipelines_pnext_shader::data;
  puStack_140 = &local_168;
  local_158 = 0;
  local_168 = 0x3b9d3b01;
  uStack_160 = 0;
  local_118.pNext = (void *)0x0;
  local_118.basePipelineHandle = (VkPipeline)0x0;
  local_118.basePipelineIndex = 0;
  local_118._92_4_ = 0;
  local_118.stage.pSpecializationInfo = (VkSpecializationInfo *)0x0;
  local_118.layout = (VkPipelineLayout)0x0;
  local_118.stage.module = (VkShaderModule)0x0;
  local_118.stage.pName = (char *)0x0;
  local_118.stage.pNext = (void *)0x0;
  local_118.stage.flags = 0;
  local_118.stage.stage = 0;
  local_118.flags = 0;
  local_118._20_4_ = 0;
  local_118.stage.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_118.stage._4_4_ = 0;
  local_118.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  local_118._4_4_ = 0;
  memset(&local_b8,0,0x90);
  local_b8.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_118.stage.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  local_118.stage.stage = VK_SHADER_STAGE_COMPUTE_BIT;
  local_118.stage.module = (VkShaderModule)0x0;
  local_118.stage.pName = "foobar";
  local_b8.stageCount = 1;
  local_118.stage.pNext = &local_148;
  local_b8.pStages = &local_118.stage;
  bVar1 = Fossilize::StateRecorder::record_compute_pipeline
                    (recorder,(VkPipeline)&DAT_000007c3,&local_118,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (bVar1) {
    bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                      (recorder,(VkPipeline)&DAT_000007c4,&local_b8,(VkPipeline *)0x0,0,0,
                       (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
    if (bVar1) {
      return;
    }
  }
  abort();
}

Assistant:

static void record_pipelines_pnext_shader(StateRecorder &recorder)
{
	VkShaderModuleCreateInfo module = { VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO };
	static const uint32_t data[] = { 1, 2, 3 };
	module.codeSize = sizeof(data);
	module.pCode = data;

	VkShaderModuleValidationCacheCreateInfoEXT validate_info = { VK_STRUCTURE_TYPE_SHADER_MODULE_VALIDATION_CACHE_CREATE_INFO_EXT };
	module.pNext = &validate_info;

	VkComputePipelineCreateInfo pipe = { VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO };
	VkGraphicsPipelineCreateInfo gpipe = { VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO };
	pipe.stage.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
	pipe.stage.stage = VK_SHADER_STAGE_COMPUTE_BIT;
	pipe.stage.module = VK_NULL_HANDLE;
	pipe.stage.pName = "foobar";
	pipe.stage.pNext = &module;
	gpipe.stageCount = 1;
	gpipe.pStages = &pipe.stage;

	if (!recorder.record_compute_pipeline(fake_handle<VkPipeline>(1987), pipe, nullptr, 0))
		abort();
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(1988), gpipe, nullptr, 0))
		abort();
}